

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void setJoinExpr(Expr *p,int iTable)

{
  int local_18;
  int i;
  int iTable_local;
  Expr *p_local;
  
  for (_i = p; _i != (Expr *)0x0; _i = _i->pRight) {
    _i->flags = _i->flags | 1;
    _i->iRightJoinTable = (i16)iTable;
    if ((_i->op == 0x97) && ((_i->x).pList != (ExprList *)0x0)) {
      for (local_18 = 0; local_18 < ((_i->x).pList)->nExpr; local_18 = local_18 + 1) {
        setJoinExpr(((_i->x).pList)->a[local_18].pExpr,iTable);
      }
    }
    setJoinExpr(_i->pLeft,iTable);
  }
  return;
}

Assistant:

static void setJoinExpr(Expr *p, int iTable){
  while( p ){
    ExprSetProperty(p, EP_FromJoin);
    assert( !ExprHasProperty(p, EP_TokenOnly|EP_Reduced) );
    ExprSetVVAProperty(p, EP_NoReduce);
    p->iRightJoinTable = (i16)iTable;
    if( p->op==TK_FUNCTION && p->x.pList ){
      int i;
      for(i=0; i<p->x.pList->nExpr; i++){
        setJoinExpr(p->x.pList->a[i].pExpr, iTable);
      }
    }
    setJoinExpr(p->pLeft, iTable);
    p = p->pRight;
  } 
}